

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_fexupl_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  byte bVar3;
  float16 a;
  uint uVar4;
  uint uVar5;
  float32 fVar6;
  float64 fVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  float_status *status;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_48 [3];
  
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar13 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      a = *(float16 *)((long)(env->active_fpu).fpr + lVar13 * 2 + (ulong)ws * 0x10 + 8);
      fVar6 = float16_to_float32_mips64(a,true,pfVar2);
      uVar12 = fVar6 | 0x80000000;
      if (-1 < (short)a) {
        uVar12 = fVar6;
      }
      *(uint *)((long)local_48 + lVar13 * 4) = uVar12;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar8 = (uint)bVar3;
      if ((uVar12 & 0x7f800000) == 0) {
        uVar8 = uVar8 | 0x10;
      }
      if ((uVar12 & 0x7fffffff) == 0) {
        uVar8 = (uint)bVar3;
      }
      uVar4 = ieee_ex_to_mips_mips64(uVar8);
      uVar12 = (env->active_tc).msacsr;
      uVar11 = (uVar12 & 0x1000000) >> 0x18 & uVar8 >> 6;
      uVar10 = 3;
      if ((uVar12 & 0x1000000) == 0) {
        uVar10 = uVar11;
      }
      if (uVar8 < 0x80) {
        uVar10 = uVar11;
      }
      uVar10 = uVar10 | uVar4;
      uVar5 = (uint)((uVar12 >> 9 & 1) == 0 & (byte)uVar4 >> 2);
      uVar11 = uVar5 | uVar10;
      uVar8 = uVar4 & 0xfffffffc;
      if ((uVar5 != 0 || (uVar10 & 1) != 0) || (uVar12 & 0x100) != 0) {
        uVar8 = uVar11;
      }
      if ((uVar10 & 2) == 0) {
        uVar8 = uVar11;
      }
      if ((uVar8 & (uVar12 >> 7 & 0x1f | 0x20)) == 0) {
        uVar10 = uVar8 << 0xc;
LAB_008d3f7d:
        (env->active_tc).msacsr = uVar10 & 0x3f000 | uVar12;
      }
      else if ((uVar12 >> 0x12 & 1) == 0) {
        uVar10 = uVar8 << 0xc | uVar12;
        uVar12 = uVar12 & 0xfff80fff;
        goto LAB_008d3f7d;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar8) != 0) {
        fVar6 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)local_48 + lVar13 * 4) = fVar6 & 0xffffffc0 ^ 0x400000 | uVar8;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1c20,
                    "void helper_msa_fexupl_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    local_48[2] = (long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8;
    lVar13 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar6 = *(float32 *)(local_48[2] + lVar13 * 4);
      fVar7 = float32_to_float64_mips64(fVar6,pfVar2);
      uVar9 = fVar7 | 0x8000000000000000;
      if (-1 < (int)fVar6) {
        uVar9 = fVar7;
      }
      local_48[lVar13] = uVar9;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar12 = (uint)bVar3;
      if ((uVar9 & 0x7ff0000000000000) == 0) {
        uVar12 = uVar12 | 0x10;
      }
      if ((uVar9 & 0x7fffffffffffffff) == 0) {
        uVar12 = (uint)bVar3;
      }
      uVar4 = ieee_ex_to_mips_mips64(uVar12);
      uVar8 = (env->active_tc).msacsr;
      uVar11 = (uVar8 & 0x1000000) >> 0x18 & uVar12 >> 6;
      uVar10 = 3;
      if ((uVar8 & 0x1000000) == 0) {
        uVar10 = uVar11;
      }
      if (uVar12 < 0x80) {
        uVar10 = uVar11;
      }
      uVar10 = uVar10 | uVar4;
      uVar5 = (uint)((uVar8 >> 9 & 1) == 0 & (byte)uVar4 >> 2);
      uVar11 = uVar5 | uVar10;
      uVar12 = uVar4 & 0xfffffffc;
      if ((uVar5 != 0 || (uVar10 & 1) != 0) || (uVar8 & 0x100) != 0) {
        uVar12 = uVar11;
      }
      if ((uVar10 & 2) == 0) {
        uVar12 = uVar11;
      }
      if ((uVar12 & (uVar8 >> 7 & 0x1f | 0x20)) == 0) {
        uVar10 = uVar12 << 0xc;
LAB_008d3e20:
        (env->active_tc).msacsr = uVar10 & 0x3f000 | uVar8;
      }
      else if ((uVar8 >> 0x12 & 1) == 0) {
        uVar10 = uVar12 << 0xc | uVar8;
        uVar8 = uVar8 & 0xfff80fff;
        goto LAB_008d3e20;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar12) != 0) {
        fVar7 = float64_default_nan_mips64(pfVar2);
        local_48[lVar13] = (long)(int)uVar12 | fVar7 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 == 1);
  }
  uVar12 = (env->active_tc).msacsr;
  uVar8 = uVar12 >> 7 & 0x1f | 0x20;
  if ((uVar8 & uVar12 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar8);
  }
  (env->active_tc).msacsr = (uVar12 >> 0xc & 0x1f) << 2 | uVar12;
  (env->active_fpu).fpr[wd].fd = local_48[0];
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = local_48[1];
  return;
}

Assistant:

void helper_msa_fexupl_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                          uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            /*
             * Half precision floats come in two formats: standard
             * IEEE and "ARM" format.  The latter gains extra exponent
             * range by omitting the NaN/Inf encodings.
             */
            flag ieee = 1;

            MSA_FLOAT_BINOP(pwx->w[i], from_float16, Lh(pws, i), ieee, 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_float32, Lw(pws, i), 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());
    msa_move_v(pwd, pwx);
}